

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTarget.cpp
# Opt level: O1

void __thiscall
Outputs::Display::OpenGL::TextureTarget::draw
          (TextureTarget *this,float aspect_ratio,float colour_threshold)

{
  unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Shader *pSVar2;
  int iVar3;
  GLint GVar4;
  GLint GVar5;
  ostream *poVar6;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  long lVar7;
  int in_ESI;
  _Alloc_hider __p;
  ulong uVar8;
  char *pcVar9;
  float buffer [16];
  char *fragment_shader;
  char *vertex_shader;
  string local_88;
  float local_68;
  undefined4 local_64;
  float local_60;
  undefined4 local_5c;
  float local_58;
  undefined4 local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  char *local_40;
  char *local_38;
  
  local_44 = colour_threshold;
  if ((this->pixel_shader_)._M_t.
      super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
      ._M_t.
      super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
      .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl !=
      (Shader *)0x0) {
LAB_003d3e57:
    if ((this->set_aspect_ratio_ != aspect_ratio) ||
       (NAN(this->set_aspect_ratio_) || NAN(aspect_ratio))) {
      this->set_aspect_ratio_ = aspect_ratio;
      local_88._M_string_length = 0;
      local_88.field_2._8_4_ = 0;
      local_88.field_2._12_4_ = (float)this->height_ / (float)this->expanded_height_;
      local_60 = (float)this->width_ / (float)this->expanded_width_;
      local_5c = 0;
      local_68 = ((float)this->width_ / (float)this->height_) / aspect_ratio;
      local_88.field_2._M_allocated_capacity._0_4_ = -local_68;
      local_88._M_dataplus._M_p._4_4_ = 0xbf800000;
      local_88._M_dataplus._M_p._0_4_ = (float)local_88.field_2._M_allocated_capacity._0_4_;
      local_88.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
      local_64 = 0xbf800000;
      local_54 = 0x3f800000;
      local_58 = local_68;
      local_50 = local_60;
      local_4c = (float)local_88.field_2._12_4_;
      glBindBuffer(0x8892,this->drawing_array_buffer_);
      iVar3 = glGetError();
      if (iVar3 == 0) {
        in_ESI = 0x40;
        in_ECX = 0x88e4;
        glBufferData(0x8892,0x40,&local_88);
        iVar3 = glGetError();
        in_RDX = extraout_RDX_01;
        if (iVar3 == 0) goto LAB_003d3f46;
        switch(iVar3) {
        case 0x500:
          pcVar9 = "GL_INVALID_ENUM";
          lVar7 = 0xf;
          break;
        case 0x501:
          pcVar9 = "GL_INVALID_VALUE";
          goto LAB_003d467d;
        case 0x502:
          pcVar9 = "GL_INVALID_OPERATION";
          lVar7 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003d4687;
        case 0x505:
          pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d467d:
          lVar7 = 0x10;
          break;
        case 0x506:
          pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar7 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4687:
        poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xaf);
        poVar6 = std::operator<<(poVar6," in ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                      ,0xaf,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                     );
      }
      switch(iVar3) {
      case 0x500:
        pcVar9 = "GL_INVALID_ENUM";
        lVar7 = 0xf;
        break;
      case 0x501:
        pcVar9 = "GL_INVALID_VALUE";
        goto LAB_003d45c7;
      case 0x502:
        pcVar9 = "GL_INVALID_OPERATION";
        lVar7 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003d45d1;
      case 0x505:
        pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d45c7:
        lVar7 = 0x10;
        break;
      case 0x506:
        pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar7 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d45d1:
      poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xae);
      poVar6 = std::operator<<(poVar6," in ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xae,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
LAB_003d3f46:
    Shader::bind((this->pixel_shader_)._M_t.
                 super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl,
                 in_ESI,in_RDX,in_ECX);
    glUniform1f(local_44,this->threshold_uniform_);
    iVar3 = glGetError();
    if (iVar3 == 0) {
      glBindVertexArray(this->drawing_vertex_array_);
      iVar3 = glGetError();
      if (iVar3 != 0) {
        switch(iVar3) {
        case 0x500:
          pcVar9 = "GL_INVALID_ENUM";
          lVar7 = 0xf;
          break;
        case 0x501:
          pcVar9 = "GL_INVALID_VALUE";
          goto LAB_003d43dc;
        case 0x502:
          pcVar9 = "GL_INVALID_OPERATION";
          lVar7 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003d43e6;
        case 0x505:
          pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d43dc:
          lVar7 = 0x10;
          break;
        case 0x506:
          pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar7 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d43e6:
        poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb5);
        poVar6 = std::operator<<(poVar6," in ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                      ,0xb5,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                     );
      }
      glDrawArrays(5,0,4);
      iVar3 = glGetError();
      if (iVar3 == 0) {
        return;
      }
      switch(iVar3) {
      case 0x500:
        pcVar9 = "GL_INVALID_ENUM";
        lVar7 = 0xf;
        break;
      case 0x501:
        pcVar9 = "GL_INVALID_VALUE";
        goto LAB_003d4492;
      case 0x502:
        pcVar9 = "GL_INVALID_OPERATION";
        lVar7 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003d449c;
      case 0x505:
        pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4492:
        lVar7 = 0x10;
        break;
      case 0x506:
        pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar7 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d449c:
      poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb6);
      poVar6 = std::operator<<(poVar6," in ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xb6,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    switch(iVar3) {
    case 0x500:
      pcVar9 = "GL_INVALID_ENUM";
      lVar7 = 0xf;
      break;
    case 0x501:
      pcVar9 = "GL_INVALID_VALUE";
      goto LAB_003d4326;
    case 0x502:
      pcVar9 = "GL_INVALID_OPERATION";
      lVar7 = 0x14;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      goto LAB_003d4330;
    case 0x505:
      pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4326:
      lVar7 = 0x10;
      break;
    case 0x506:
      pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      lVar7 = 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4330:
    poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb3);
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0xb3,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  this_00 = &this->pixel_shader_;
  local_38 = 
  "#version 150\nin vec2 texCoord;in vec2 position;out vec2 texCoordVarying;void main(void){texCoordVarying = texCoord;gl_Position = vec4(position, 0.0, 1.0);}"
  ;
  local_40 = 
  "#version 150\nin vec2 texCoordVarying;uniform sampler2D texID;uniform float threshold;out vec4 fragColour;void main(void){fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);}"
  ;
  local_48 = aspect_ratio;
  std::make_unique<Outputs::Display::OpenGL::Shader,char_const*&,char_const*&>
            ((char **)&local_88,&local_38);
  __p._M_p = local_88._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  ::reset((__uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
           *)this_00,(pointer)__p._M_p);
  iVar3 = (int)__p._M_p;
  std::
  unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  ::~unique_ptr((unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                 *)&local_88);
  Shader::bind((this->pixel_shader_)._M_t.
               super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
               ._M_t.
               super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
               .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl,iVar3,
               __addr,in_ECX);
  glGenVertexArrays(1,&this->drawing_vertex_array_);
  iVar3 = glGetError();
  if (iVar3 == 0) {
    glGenBuffers(1,&this->drawing_array_buffer_);
    iVar3 = glGetError();
    if (iVar3 == 0) {
      glBindVertexArray(this->drawing_vertex_array_);
      iVar3 = glGetError();
      if (iVar3 == 0) {
        glBindBuffer(0x8892,this->drawing_array_buffer_);
        iVar3 = glGetError();
        if (iVar3 == 0) {
          pSVar2 = (this_00->_M_t).
                   super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
          paVar1 = &local_88.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"position","");
          GVar4 = Shader::get_attrib_location(pSVar2,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pSVar2 = (this_00->_M_t).
                   super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>._M_head_impl;
          local_88._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"texCoord","");
          GVar5 = Shader::get_attrib_location(pSVar2,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                     local_88.field_2._M_allocated_capacity._0_4_) + 1);
          }
          glEnableVertexAttribArray(GVar4);
          iVar3 = glGetError();
          if (iVar3 == 0) {
            glEnableVertexAttribArray(GVar5);
            iVar3 = glGetError();
            if (iVar3 == 0) {
              glVertexAttribPointer(GVar4,2,0x1406,0,0x10,0);
              iVar3 = glGetError();
              if (iVar3 == 0) {
                in_ECX = 0;
                glVertexAttribPointer(GVar5,2,0x1406,0,0x10,8);
                iVar3 = glGetError();
                if (iVar3 == 0) {
                  pSVar2 = (this_00->_M_t).
                           super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                           .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>.
                           _M_head_impl;
                  local_88._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"texID","");
                  GVar4 = Shader::get_uniform_location(pSVar2,&local_88);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != paVar1) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                             local_88.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  glUniform1i(GVar4,this->texture_unit_ - 0x84c0);
                  iVar3 = glGetError();
                  if (iVar3 == 0) {
                    pSVar2 = (this_00->_M_t).
                             super___uniq_ptr_impl<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Outputs::Display::OpenGL::Shader_*,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                             .super__Head_base<0UL,_Outputs::Display::OpenGL::Shader_*,_false>.
                             _M_head_impl;
                    local_88._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_88,"threshold","");
                    in_ESI = (int)&local_88;
                    GVar4 = Shader::get_uniform_location(pSVar2,&local_88);
                    this->threshold_uniform_ = GVar4;
                    in_RDX = extraout_RDX;
                    aspect_ratio = local_48;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != paVar1) {
                      uVar8 = CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                       local_88.field_2._M_allocated_capacity._0_4_) + 1;
                      operator_delete(local_88._M_dataplus._M_p,uVar8);
                      in_ESI = (int)uVar8;
                      in_RDX = extraout_RDX_00;
                      aspect_ratio = local_48;
                    }
                    goto LAB_003d3e57;
                  }
                  switch(iVar3) {
                  case 0x500:
                    pcVar9 = "GL_INVALID_ENUM";
                    lVar7 = 0xf;
                    break;
                  case 0x501:
                    pcVar9 = "GL_INVALID_VALUE";
                    goto LAB_003d4d39;
                  case 0x502:
                    pcVar9 = "GL_INVALID_OPERATION";
                    lVar7 = 0x14;
                    break;
                  default:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Error ",6);
                    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                    goto LAB_003d4d43;
                  case 0x505:
                    pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4d39:
                    lVar7 = 0x10;
                    break;
                  case 0x506:
                    pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                    lVar7 = 0x20;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4d43:
                  poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x91);
                  poVar6 = std::operator<<(poVar6," in ");
                  poVar6 = std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                          );
                  std::endl<char,std::char_traits<char>>(poVar6);
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                ,0x91,
                                "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                               );
                }
                switch(iVar3) {
                case 0x500:
                  pcVar9 = "GL_INVALID_ENUM";
                  lVar7 = 0xf;
                  break;
                case 0x501:
                  pcVar9 = "GL_INVALID_VALUE";
                  goto LAB_003d4c83;
                case 0x502:
                  pcVar9 = "GL_INVALID_OPERATION";
                  lVar7 = 0x14;
                  break;
                default:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Error ",6);
                  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  goto LAB_003d4c8d;
                case 0x505:
                  pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4c83:
                  lVar7 = 0x10;
                  break;
                case 0x506:
                  pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                  lVar7 = 0x20;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4c8d:
                poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8e);
                poVar6 = std::operator<<(poVar6," in ");
                poVar6 = std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                        );
                std::endl<char,std::char_traits<char>>(poVar6);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              ,0x8e,
                              "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                             );
              }
              switch(iVar3) {
              case 0x500:
                pcVar9 = "GL_INVALID_ENUM";
                lVar7 = 0xf;
                break;
              case 0x501:
                pcVar9 = "GL_INVALID_VALUE";
                goto LAB_003d4bcd;
              case 0x502:
                pcVar9 = "GL_INVALID_OPERATION";
                lVar7 = 0x14;
                break;
              default:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6)
                ;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                goto LAB_003d4bd7;
              case 0x505:
                pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4bcd:
                lVar7 = 0x10;
                break;
              case 0x506:
                pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                lVar7 = 0x20;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7)
              ;
LAB_003d4bd7:
              poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8d);
              poVar6 = std::operator<<(poVar6," in ");
              poVar6 = std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                      );
              std::endl<char,std::char_traits<char>>(poVar6);
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            ,0x8d,
                            "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                           );
            }
            switch(iVar3) {
            case 0x500:
              pcVar9 = "GL_INVALID_ENUM";
              lVar7 = 0xf;
              break;
            case 0x501:
              pcVar9 = "GL_INVALID_VALUE";
              goto LAB_003d4b17;
            case 0x502:
              pcVar9 = "GL_INVALID_OPERATION";
              lVar7 = 0x14;
              break;
            default:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              goto LAB_003d4b21;
            case 0x505:
              pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4b17:
              lVar7 = 0x10;
              break;
            case 0x506:
              pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
              lVar7 = 0x20;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4b21:
            poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8a);
            poVar6 = std::operator<<(poVar6," in ");
            poVar6 = std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                    );
            std::endl<char,std::char_traits<char>>(poVar6);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                          ,0x8a,
                          "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
          }
          switch(iVar3) {
          case 0x500:
            pcVar9 = "GL_INVALID_ENUM";
            lVar7 = 0xf;
            break;
          case 0x501:
            pcVar9 = "GL_INVALID_VALUE";
            goto LAB_003d4a61;
          case 0x502:
            pcVar9 = "GL_INVALID_OPERATION";
            lVar7 = 0x14;
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            goto LAB_003d4a6b;
          case 0x505:
            pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4a61:
            lVar7 = 0x10;
            break;
          case 0x506:
            pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
            lVar7 = 0x20;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4a6b:
          poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x89);
          poVar6 = std::operator<<(poVar6," in ");
          poVar6 = std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                        ,0x89,
                        "void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
        }
        switch(iVar3) {
        case 0x500:
          pcVar9 = "GL_INVALID_ENUM";
          lVar7 = 0xf;
          break;
        case 0x501:
          pcVar9 = "GL_INVALID_VALUE";
          goto LAB_003d49ab;
        case 0x502:
          pcVar9 = "GL_INVALID_OPERATION";
          lVar7 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003d49b5;
        case 0x505:
          pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d49ab:
          lVar7 = 0x10;
          break;
        case 0x506:
          pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar7 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d49b5:
        poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x84);
        poVar6 = std::operator<<(poVar6," in ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                      ,0x84,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const"
                     );
      }
      switch(iVar3) {
      case 0x500:
        pcVar9 = "GL_INVALID_ENUM";
        lVar7 = 0xf;
        break;
      case 0x501:
        pcVar9 = "GL_INVALID_VALUE";
        goto LAB_003d48f5;
      case 0x502:
        pcVar9 = "GL_INVALID_OPERATION";
        lVar7 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003d48ff;
      case 0x505:
        pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d48f5:
        lVar7 = 0x10;
        break;
      case 0x506:
        pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar7 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d48ff:
      poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x83);
      poVar6 = std::operator<<(poVar6," in ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x83,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    switch(iVar3) {
    case 0x500:
      pcVar9 = "GL_INVALID_ENUM";
      lVar7 = 0xf;
      break;
    case 0x501:
      pcVar9 = "GL_INVALID_VALUE";
      goto LAB_003d483f;
    case 0x502:
      pcVar9 = "GL_INVALID_OPERATION";
      lVar7 = 0x14;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      goto LAB_003d4849;
    case 0x505:
      pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d483f:
      lVar7 = 0x10;
      break;
    case 0x506:
      pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      lVar7 = 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4849:
    poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x81);
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0x81,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  switch(iVar3) {
  case 0x500:
    pcVar9 = "GL_INVALID_ENUM";
    lVar7 = 0xf;
    break;
  case 0x501:
    pcVar9 = "GL_INVALID_VALUE";
    goto LAB_003d4789;
  case 0x502:
    pcVar9 = "GL_INVALID_OPERATION";
    lVar7 = 0x14;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    goto LAB_003d4793;
  case 0x505:
    pcVar9 = "GL_OUT_OF_MEMORY";
LAB_003d4789:
    lVar7 = 0x10;
    break;
  case 0x506:
    pcVar9 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    lVar7 = 0x20;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
LAB_003d4793:
  poVar6 = std::operator<<((ostream *)&std::cerr," at line ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x80);
  poVar6 = std::operator<<(poVar6," in ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                ,0x80,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
}

Assistant:

void TextureTarget::draw(float aspect_ratio, float colour_threshold) const {
	if(!pixel_shader_) {
		const char *vertex_shader =
			"#version 150\n"

			"in vec2 texCoord;"
			"in vec2 position;"

			"out vec2 texCoordVarying;"

			"void main(void)"
			"{"
				"texCoordVarying = texCoord;"
				"gl_Position = vec4(position, 0.0, 1.0);"
			"}";
		const char *fragment_shader =
			"#version 150\n"

			"in vec2 texCoordVarying;"

			"uniform sampler2D texID;"
			"uniform float threshold;"

			"out vec4 fragColour;"

			"void main(void)"
			"{"
				"fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);"
			"}";
		pixel_shader_ = std::make_unique<Shader>(vertex_shader, fragment_shader);
		pixel_shader_->bind();

		test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
		test_gl(glGenBuffers, 1, &drawing_array_buffer_);

		test_gl(glBindVertexArray, drawing_vertex_array_);
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

		const GLint position_attribute	= pixel_shader_->get_attrib_location("position");
		const GLint tex_coord_attribute	= pixel_shader_->get_attrib_location("texCoord");

		test_gl(glEnableVertexAttribArray, GLuint(position_attribute));
		test_gl(glEnableVertexAttribArray, GLuint(tex_coord_attribute));

		const GLsizei vertex_stride = 4 * sizeof(GLfloat);
		test_gl(glVertexAttribPointer, GLuint(position_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)0);
		test_gl(glVertexAttribPointer, GLuint(tex_coord_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)(2 * sizeof(GLfloat)));

		const GLint texIDUniform = pixel_shader_->get_uniform_location("texID");
		test_gl(glUniform1i, texIDUniform, GLint(texture_unit_ - GL_TEXTURE0));

		threshold_uniform_ = pixel_shader_->get_uniform_location("threshold");
	}

	if(set_aspect_ratio_ != aspect_ratio) {
		set_aspect_ratio_ = aspect_ratio;
		float buffer[4*4];

		// establish texture coordinates
		buffer[2] = 0.0f;
		buffer[3] = 0.0f;
		buffer[6] = 0.0f;
		buffer[7] = float(height_) / float(expanded_height_);
		buffer[10] = float(width_) / float(expanded_width_);
		buffer[11] = 0.0f;
		buffer[14] = buffer[10];
		buffer[15] = buffer[7];

		// determine positions; rule is to keep the same height and centre
		float internal_aspect_ratio = float(width_) / float(height_);
		float aspect_ratio_ratio = internal_aspect_ratio / aspect_ratio;

		buffer[0] = -aspect_ratio_ratio;	buffer[1] = -1.0f;
		buffer[4] = -aspect_ratio_ratio;	buffer[5] = 1.0f;
		buffer[8] = aspect_ratio_ratio;		buffer[9] = -1.0f;
		buffer[12] = aspect_ratio_ratio;	buffer[13] = 1.0f;

		// upload buffer
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
		test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
	}

	pixel_shader_->bind();
	test_gl(glUniform1f, threshold_uniform_, colour_threshold);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glDrawArrays, GL_TRIANGLE_STRIP, 0, 4);
}